

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::couv_dfs
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,zg_t *ts,graph_t *graph,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,stats_t *stats)

{
  bool bVar1;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  *p1;
  node_t *pnVar2;
  uint *puVar3;
  bool *pbVar4;
  int local_58;
  node_sptr_t t;
  node_sptr_t *n_1;
  stats_t *stats_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels_local;
  graph_t *graph_local;
  zg_t *ts_local;
  node_sptr_t *n_local;
  single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this_local;
  
  push(this,n,ts,graph,labels,stats);
  do {
    while( true ) {
      bVar1 = std::
              stack<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>_>
              ::empty(&this->_todo);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      t._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)std::
                stack<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>_>
                ::top(&this->_todo);
      bVar1 = std::
              deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
              ::empty(&((reference)t._t)->succ);
      if (!bVar1) break;
      p1 = &std::
            stack<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>_>
            ::top(&this->_roots)->n;
      bVar1 = tchecker::operator==
                        (p1,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                             *)t._t);
      if (bVar1) {
        close_scc(this,(node_sptr_t *)t._t);
      }
      std::
      stack<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>_>
      ::pop(&this->_todo);
    }
    std::
    stack<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>_>
    ::top(&this->_todo);
    todo_stack_entry_t::pick_successor((todo_stack_entry_t *)&stack0xffffffffffffffb8);
    pnVar2 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                           *)&stack0xffffffffffffffb8);
    puVar3 = couvscc::node_t::dfsnum(pnVar2);
    if (*puVar3 == 0) {
      push(this,(node_sptr_t *)&stack0xffffffffffffffb8,ts,graph,labels,stats);
LAB_0014c33e:
      local_58 = 0;
    }
    else {
      pnVar2 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
               ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                             *)&stack0xffffffffffffffb8);
      pbVar4 = couvscc::node_t::current(pnVar2);
      if ((*pbVar4 & 1U) == 0) goto LAB_0014c33e;
      merge_scc(this,(node_sptr_t *)&stack0xffffffffffffffb8,stats);
      pbVar4 = stats_t::cycle(stats);
      if ((*pbVar4 & 1U) == 0) goto LAB_0014c33e;
      local_58 = 3;
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffffb8);
    if (local_58 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void couv_dfs(node_sptr_t & n, TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                tchecker::algorithms::couvscc::stats_t & stats)
  {
    push(n, ts, graph, labels, stats);
    while (!_todo.empty()) {
      auto && [n, succ] = _todo.top();
      if (succ.empty()) {
        if (_roots.top().n == n)
          close_scc(n);
        _todo.pop();
      }
      else {
        node_sptr_t t = _todo.top().pick_successor();
        if (t->dfsnum() == 0)
          push(t, ts, graph, labels, stats);
        else if (t->current()) {
          merge_scc(t, stats);
          if (stats.cycle())
            break;
        }
      }
    }
  }